

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HModel.cpp
# Opt level: O2

void __thiscall HModel::initRandomVec(HModel *this)

{
  int iVar1;
  pointer piVar2;
  int iVar3;
  int i;
  long lVar4;
  int i_1;
  ulong uVar5;
  double dVar6;
  
  std::vector<int,_std::allocator<int>_>::resize(&this->intBreak,(long)this->numTot);
  piVar2 = (this->intBreak).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  for (lVar4 = 0; lVar4 < this->numTot; lVar4 = lVar4 + 1) {
    piVar2[lVar4] = (int)lVar4;
  }
  for (uVar5 = (ulong)(uint)this->numTot; 1 < (int)uVar5; uVar5 = uVar5 - 1) {
    iVar3 = HRandom::intRandom(&this->random);
    iVar3 = iVar3 % (int)uVar5;
    piVar2 = (this->intBreak).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    iVar1 = piVar2[uVar5 - 1];
    piVar2[uVar5 - 1] = piVar2[iVar3];
    piVar2[iVar3] = iVar1;
  }
  std::vector<double,_std::allocator<double>_>::resize(&this->dblXpert,(long)this->numTot);
  for (lVar4 = 0; lVar4 < this->numTot; lVar4 = lVar4 + 1) {
    dVar6 = HRandom::dblRandom(&this->random);
    (this->dblXpert).super__Vector_base<double,_std::allocator<double>_>._M_impl.
    super__Vector_impl_data._M_start[lVar4] = dVar6;
  }
  return;
}

Assistant:

void HModel::initRandomVec() {
  intBreak.resize(numTot);
  for (int i = 0; i < numTot; i++)
    intBreak[i] = i;
  for (int i = numTot - 1; i >= 1; i--) {
    int j = random.intRandom() % (i + 1);
    swap(intBreak[i], intBreak[j]);
  }
  dblXpert.resize(numTot);
  for (int i = 0; i < numTot; i++)
    dblXpert[i] = random.dblRandom();
  
}